

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

void js_promise_finalizer(JSRuntime *rt,JSValue val)

{
  int *piVar1;
  int iVar2;
  JSPromiseReactionData *pJVar3;
  JSValue v;
  JSPromiseReactionData *rd;
  long lVar4;
  void *pvVar5;
  bool bVar6;
  
  if (((int)val.tag == -1) && (*(short *)((long)val.u.ptr + 6) == 0x2a)) {
    pvVar5 = *(void **)((long)val.u.ptr + 0x30);
  }
  else {
    pvVar5 = (void *)0x0;
  }
  if (pvVar5 == (void *)0x0) {
    return;
  }
  lVar4 = 0;
  do {
    rd = *(JSPromiseReactionData **)((long)pvVar5 + lVar4 * 0x10 + 0x10);
    while (rd != (JSPromiseReactionData *)((long)pvVar5 + lVar4 * 0x10 + 8)) {
      pJVar3 = (JSPromiseReactionData *)(rd->link).next;
      promise_reaction_data_free(rt,rd);
      rd = pJVar3;
    }
    bVar6 = lVar4 == 0;
    lVar4 = lVar4 + 1;
  } while (bVar6);
  piVar1 = (int *)(((JSValue *)((long)pvVar5 + 0x30))->u).ptr;
  v = *(JSValue *)((long)pvVar5 + 0x30);
  if ((0xfffffff4 < (uint)*(undefined8 *)((long)pvVar5 + 0x38)) &&
     (iVar2 = *piVar1, *piVar1 = iVar2 + -1, iVar2 < 2)) {
    __JS_FreeValueRT(rt,v);
  }
  (*(rt->mf).js_free)(&rt->malloc_state,pvVar5);
  return;
}

Assistant:

static void js_promise_finalizer(JSRuntime *rt, JSValue val)
{
    JSPromiseData *s = JS_GetOpaque(val, JS_CLASS_PROMISE);
    struct list_head *el, *el1;
    int i;

    if (!s)
        return;
    for(i = 0; i < 2; i++) {
        list_for_each_safe(el, el1, &s->promise_reactions[i]) {
            JSPromiseReactionData *rd =
                list_entry(el, JSPromiseReactionData, link);
            promise_reaction_data_free(rt, rd);
        }
    }
    JS_FreeValueRT(rt, s->promise_result);
    js_free_rt(rt, s);
}